

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool __thiscall ON_CheckSum::SetFileCheckSum(ON_CheckSum *this,wchar_t *filename)

{
  bool bVar1;
  FILE *fp;
  
  Zero(this);
  bVar1 = true;
  if ((filename != (wchar_t *)0x0) && (*filename != L'\0')) {
    fp = ON::OpenFile(filename,L"rb");
    if (fp == (FILE *)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = SetFileCheckSum(this,fp);
      ON::CloseFile(fp);
    }
  }
  return bVar1;
}

Assistant:

bool ON_CheckSum::SetFileCheckSum( const wchar_t* filename )
{
  bool rc = false;
  Zero();
  if ( 0 == filename || 0 == filename[0] )
  {
    rc = true;
  }
  else
  {
    FILE* fp = ON::OpenFile(filename,L"rb");
    if ( fp )
    {
      rc = SetFileCheckSum(fp);
      ON::CloseFile(fp);
    }
  }
  return rc;
}